

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

int loop_filter_row_worker(void *arg1,void *arg2)

{
  int iVar1;
  macroblockd_plane *planes;
  undefined8 unaff_RBX;
  aom_internal_error_info *unaff_RBP;
  AV1_COMMON *in_RSI;
  YV12_BUFFER_CONFIG *in_RDI;
  AV1LfSync *unaff_R14;
  AV1_DEBLOCKING_PARAMETERS *unaff_retaddr;
  TX_SIZE *in_stack_00000008;
  int in_stack_00000010;
  int lpf_opt_level;
  aom_internal_error_info *error_info;
  pthread_mutex_t *job_mutex_;
  AV1LfMTInfo *cur_job_info;
  LFWorkerData *lf_data;
  AV1LfSync *lf_sync;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  AV1LfSync *in_stack_ffffffffffffff78;
  AV1_COMMON *in_stack_ffffffffffffff80;
  qm_val_t **ppqVar2;
  pthread_mutex_t *__mutex;
  int in_stack_ffffffffffffffe0;
  int local_1c;
  
  __mutex = (pthread_mutex_t *)in_RDI->y_pyramid;
  ppqVar2 = (in_RSI->quant_params).gqmatrix[0][2] + 6;
  iVar1 = _setjmp((__jmp_buf_tag *)((in_RSI->quant_params).gqmatrix[1][0] + 0xe));
  if (iVar1 == 0) {
    *(undefined4 *)(ppqVar2 + 0x1a) = 1;
    while( true ) {
      planes = (macroblockd_plane *)
               get_lf_job_info((AV1LfSync *)
                               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if (planes == (macroblockd_plane *)0x0) break;
      in_stack_ffffffffffffff70 = *(undefined4 *)&planes->field_0xc;
      av1_thread_loop_filter_rows
                (in_RDI,in_RSI,planes,(MACROBLOCKD *)&__mutex->__data,(int)((ulong)ppqVar2 >> 0x20),
                 (int)ppqVar2,in_stack_ffffffffffffffe0,(int)unaff_RBX,unaff_R14,unaff_RBP,
                 unaff_retaddr,in_stack_00000008,in_stack_00000010);
    }
    *(undefined4 *)(ppqVar2 + 0x1a) = 0;
    local_1c = 1;
  }
  else {
    *(undefined4 *)(ppqVar2 + 0x1a) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)&in_RDI->buffer_alloc_sz = 1;
    pthread_mutex_unlock(__mutex);
    av1_set_vert_loop_filter_done
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

static int loop_filter_row_worker(void *arg1, void *arg2) {
  AV1LfSync *const lf_sync = (AV1LfSync *)arg1;
  LFWorkerData *const lf_data = (LFWorkerData *)arg2;
  AV1LfMTInfo *cur_job_info;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *job_mutex_ = lf_sync->job_mutex;
#endif

  struct aom_internal_error_info *const error_info = &lf_data->error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(job_mutex_);
    lf_sync->lf_mt_exit = true;
    pthread_mutex_unlock(job_mutex_);
#endif
    av1_set_vert_loop_filter_done(lf_data->cm, lf_sync, MAX_MIB_SIZE_LOG2);
    return 0;
  }
  error_info->setjmp = 1;

  while ((cur_job_info = get_lf_job_info(lf_sync)) != NULL) {
    const int lpf_opt_level = cur_job_info->lpf_opt_level;
    av1_thread_loop_filter_rows(
        lf_data->frame_buffer, lf_data->cm, lf_data->planes, lf_data->xd,
        cur_job_info->mi_row, cur_job_info->plane, cur_job_info->dir,
        lpf_opt_level, lf_sync, error_info, lf_data->params_buf,
        lf_data->tx_buf, MAX_MIB_SIZE_LOG2);
  }
  error_info->setjmp = 0;
  return 1;
}